

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalEncoder::MeshEdgebreakerTraversalEncoder
          (MeshEdgebreakerTraversalEncoder *this)

{
  RAnsBitEncoder *in_RDI;
  RAnsBitEncoder *this_00;
  
  this_00 = in_RDI;
  RAnsBitEncoder::RAnsBitEncoder(in_RDI);
  EncoderBuffer::EncoderBuffer((EncoderBuffer *)this_00);
  in_RDI[1].local_bits_ = 0;
  in_RDI[1].num_local_bits_ = 0;
  std::
  vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
  ::vector((vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
            *)0x193db4);
  std::unique_ptr<draco::RAnsBitEncoder[],std::default_delete<draco::RAnsBitEncoder[]>>::
  unique_ptr<std::default_delete<draco::RAnsBitEncoder[]>,void>
            ((unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_> *)
             this_00,in_RDI);
  *(undefined4 *)
   &in_RDI[2].bits_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  return;
}

Assistant:

MeshEdgebreakerTraversalEncoder()
      : encoder_impl_(nullptr),
        attribute_connectivity_encoders_(nullptr),
        num_attribute_data_(0) {}